

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathOptimizeExpression(xmlXPathParserContextPtr pctxt,xmlXPathStepOpPtr op)

{
  int iVar1;
  xmlXPathCompExprPtr pxVar2;
  xmlXPathStepOp *pxVar3;
  xmlXPathContextPtr pxVar4;
  uint uVar5;
  long lVar6;
  
  if (op->op != XPATH_OP_VALUE) {
    pxVar2 = pctxt->comp;
    if ((((((op->op == XPATH_OP_COLLECT) && (lVar6 = (long)op->ch1, lVar6 != -1)) && (op->ch2 == -1)
          ) && ((pxVar3 = pxVar2->steps, pxVar3[lVar6].op == XPATH_OP_COLLECT &&
                (pxVar3[lVar6].value == 6)))) &&
        ((pxVar3[lVar6].ch2 == -1 && ((pxVar3[lVar6].value2 == 1 && (pxVar3[lVar6].value3 == 0))))))
       && ((uVar5 = op->value - 4, uVar5 < 10 && ((0x207U >> (uVar5 & 0x1f) & 1) != 0)))) {
      iVar1 = *(int *)(&DAT_001e713c + (ulong)uVar5 * 4);
      op->ch1 = pxVar3[lVar6].ch1;
      op->value = iVar1;
    }
    pxVar4 = pctxt->context;
    if (pxVar4 != (xmlXPathContextPtr)0x0) {
      if (4999 < pxVar4->depth) {
        return;
      }
      pxVar4->depth = pxVar4->depth + 1;
    }
    if ((long)op->ch1 != -1) {
      xmlXPathOptimizeExpression(pctxt,pxVar2->steps + op->ch1);
    }
    if ((long)op->ch2 != -1) {
      xmlXPathOptimizeExpression(pctxt,pxVar2->steps + op->ch2);
    }
    if (pxVar4 != (xmlXPathContextPtr)0x0) {
      pxVar4->depth = pxVar4->depth + -1;
    }
  }
  return;
}

Assistant:

static void
xmlXPathOptimizeExpression(xmlXPathParserContextPtr pctxt,
                           xmlXPathStepOpPtr op)
{
    xmlXPathCompExprPtr comp = pctxt->comp;
    xmlXPathContextPtr ctxt;

    /*
    * Try to rewrite "descendant-or-self::node()/foo" to an optimized
    * internal representation.
    */

    if ((op->op == XPATH_OP_COLLECT /* 11 */) &&
        (op->ch1 != -1) &&
        (op->ch2 == -1 /* no predicate */))
    {
        xmlXPathStepOpPtr prevop = &comp->steps[op->ch1];

        if ((prevop->op == XPATH_OP_COLLECT /* 11 */) &&
            ((xmlXPathAxisVal) prevop->value ==
                AXIS_DESCENDANT_OR_SELF) &&
            (prevop->ch2 == -1) &&
            ((xmlXPathTestVal) prevop->value2 == NODE_TEST_TYPE) &&
            ((xmlXPathTypeVal) prevop->value3 == NODE_TYPE_NODE))
        {
            /*
            * This is a "descendant-or-self::node()" without predicates.
            * Try to eliminate it.
            */

            switch ((xmlXPathAxisVal) op->value) {
                case AXIS_CHILD:
                case AXIS_DESCENDANT:
                    /*
                    * Convert "descendant-or-self::node()/child::" or
                    * "descendant-or-self::node()/descendant::" to
                    * "descendant::"
                    */
                    op->ch1   = prevop->ch1;
                    op->value = AXIS_DESCENDANT;
                    break;
                case AXIS_SELF:
                case AXIS_DESCENDANT_OR_SELF:
                    /*
                    * Convert "descendant-or-self::node()/self::" or
                    * "descendant-or-self::node()/descendant-or-self::" to
                    * to "descendant-or-self::"
                    */
                    op->ch1   = prevop->ch1;
                    op->value = AXIS_DESCENDANT_OR_SELF;
                    break;
                default:
                    break;
            }
	}
    }

    /* OP_VALUE has invalid ch1. */
    if (op->op == XPATH_OP_VALUE)
        return;

    /* Recurse */
    ctxt = pctxt->context;
    if (ctxt != NULL) {
        if (ctxt->depth >= XPATH_MAX_RECURSION_DEPTH)
            return;
        ctxt->depth += 1;
    }
    if (op->ch1 != -1)
        xmlXPathOptimizeExpression(pctxt, &comp->steps[op->ch1]);
    if (op->ch2 != -1)
	xmlXPathOptimizeExpression(pctxt, &comp->steps[op->ch2]);
    if (ctxt != NULL)
        ctxt->depth -= 1;
}